

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

RSA * d2i_RSA_PUBKEY(RSA **a,uchar **pp,long length)

{
  bool bVar1;
  EVP_PKEY *__p;
  EVP_PKEY *pkey_00;
  pointer prVar2;
  uint8_t *puVar3;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_50;
  UniquePtr<RSA> rsa;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  RSA **out_local;
  
  if (length < 0) {
    out_local = (RSA **)0x0;
  }
  else {
    CBS_init((CBS *)&pkey,*pp,length);
    __p = EVP_parse_public_key((CBS *)&pkey);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_40,__p);
    bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
    if (bVar1) {
      out_local = (RSA **)0x0;
      rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl._4_4_ = 1;
    }
    else {
      pkey_00 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
      prVar2 = (pointer)EVP_PKEY_get1_RSA(pkey_00);
      std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&local_50,prVar2);
      bVar1 = std::operator==(&local_50,(nullptr_t)0x0);
      if (bVar1) {
        out_local = (RSA **)0x0;
      }
      else {
        if (a != (RSA **)0x0) {
          RSA_free(*a);
          prVar2 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get(&local_50);
          *a = (RSA *)prVar2;
        }
        puVar3 = CBS_data((CBS *)&pkey);
        *pp = puVar3;
        out_local = (RSA **)std::unique_ptr<rsa_st,_bssl::internal::Deleter>::release(&local_50);
      }
      rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  return (RSA *)out_local;
}

Assistant:

RSA *d2i_RSA_PUBKEY(RSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<RSA> rsa(EVP_PKEY_get1_RSA(pkey.get()));
  if (rsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    RSA_free(*out);
    *out = rsa.get();
  }
  *inp = CBS_data(&cbs);
  return rsa.release();
}